

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O3

uint8_t __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler::
get_port_input(VIAPortHandler *this,Port port)

{
  QuadratureMouse *pQVar1;
  byte bVar2;
  long lVar3;
  
  if (port == A) {
    return '\0';
  }
  if (port == B) {
    pQVar1 = this->mouse_;
    lVar3 = (this->machine_->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ %
            0x3f980 + (this->machine_->video_).frame_position_.super_WrappedInt<HalfCycles>.length_;
    bVar2 = 0x40;
    if (lVar3 % 0x2c0 < 0x200) {
      bVar2 = (0x155 < (int)(lVar3 / 0x2c0)) << 6;
    }
    return (bVar2 | this->clock_->result_ >> 6 & 2 |
                    ((byte)(pQVar1->primaries_[1] << 4) | (byte)(pQVar1->secondaries_[1] << 5)) &
                    0x20 | (((byte)(pQVar1->primaries_[0] << 3) |
                            (byte)(pQVar1->secondaries_[0] << 4)) & 0x10) +
                           ((byte)(this->mouse_->button_flags_).super___atomic_base<int>._M_i & 1) *
                           '\b') ^ 8;
  }
  return 0xff;
}

Assistant:

uint8_t get_port_input(Port port) {
					switch(port) {
						case Port::A:
//							printf("6522 r A\n");
						return 0x00;	// TODO: b7 = SCC wait/request

						case Port::B:
						return uint8_t(
							((mouse_.get_button_mask() & 1) ? 0x00 : 0x08) |
							((mouse_.get_channel(0) & 2) << 3) |
							((mouse_.get_channel(1) & 2) << 4) |
							(clock_.get_data() ? 0x02 : 0x00) |
							(machine_.video_is_outputting() ? 0x00 : 0x40)
						);
					}

					// Should be unreachable.
					return 0xff;
				}